

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_tst_xmlmodelserialiser.cpp
# Opt level: O0

void * __thiscall tst_XmlModelSerialiser::qt_metacast(tst_XmlModelSerialiser *this,char *_clname)

{
  int iVar1;
  char *_clname_local;
  tst_XmlModelSerialiser *this_local;
  
  if (_clname == (char *)0x0) {
    this_local = (tst_XmlModelSerialiser *)0x0;
  }
  else {
    iVar1 = strcmp(_clname,qt_meta_stringdata_tst_XmlModelSerialiser.stringdata0);
    this_local = this;
    if (iVar1 != 0) {
      iVar1 = strcmp(_clname,"tst_SerialiserCommon");
      if (iVar1 == 0) {
        this_local = (tst_XmlModelSerialiser *)&this->super_tst_SerialiserCommon;
      }
      else {
        this_local = (tst_XmlModelSerialiser *)QObject::qt_metacast((char *)this);
      }
    }
  }
  return this_local;
}

Assistant:

void *tst_XmlModelSerialiser::qt_metacast(const char *_clname)
{
    if (!_clname) return nullptr;
    if (!strcmp(_clname, qt_meta_stringdata_tst_XmlModelSerialiser.stringdata0))
        return static_cast<void*>(this);
    if (!strcmp(_clname, "tst_SerialiserCommon"))
        return static_cast< tst_SerialiserCommon*>(this);
    return QObject::qt_metacast(_clname);
}